

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcDirection::~IfcDirection(IfcDirection *this)

{
  ~IfcDirection((IfcDirection *)&this[-1].field_0x40);
  return;
}

Assistant:

IfcDirection() : Object("IfcDirection") {}